

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O0

void __thiscall tf::TFProfObserver::Summary::dump_wsum(Summary *this,ostream *os)

{
  anon_class_8_1_ba1d5cc4 __f;
  anon_class_8_1_ba1d3afb __f_00;
  anon_class_8_1_ba1d3ebc __f_01;
  anon_class_8_1_a7a8096a __f_02;
  anon_class_8_1_a84b54ea __f_03;
  anon_class_8_1_a847d77c __f_04;
  ulong uVar1;
  bool bVar2;
  _Setw _Var3;
  ostream *poVar4;
  size_type sVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  char *pcVar8;
  ostream *in_RSI;
  long in_RDI;
  size_t i;
  bool first;
  WorkerSummary *ws;
  const_iterator __end1;
  const_iterator __begin1;
  vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
  *__range1;
  size_t max_w;
  size_t min_w;
  size_t avg_w;
  size_t d_w;
  size_t c_w;
  size_t l_w;
  size_t t_w;
  size_t w_w;
  undefined4 in_stack_fffffffffffffcf8;
  float in_stack_fffffffffffffcfc;
  __normal_iterator<const_tf::TFProfObserver::WorkerSummary_*,_std::vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>_>
  in_stack_fffffffffffffd00;
  __normal_iterator<const_tf::TFProfObserver::WorkerSummary_*,_std::vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>_>
  in_stack_fffffffffffffd08;
  string local_1d8 [32];
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  int local_1a8;
  string local_198 [32];
  int local_178;
  int local_174;
  int local_170;
  _Setw local_16c;
  ulong local_168;
  byte local_159;
  int local_158;
  int local_154;
  reference local_150;
  WorkerSummary *local_148;
  __normal_iterator<const_tf::TFProfObserver::WorkerSummary_*,_std::vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>_>
  local_140;
  long local_138;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  size_t *local_110;
  undefined8 *local_108;
  WorkerSummary *local_100;
  WorkerSummary *local_f8;
  size_t *local_f0;
  undefined8 *local_e8;
  WorkerSummary *local_e0;
  WorkerSummary *local_d8;
  size_t *local_d0;
  undefined8 *local_c8;
  WorkerSummary *local_c0;
  WorkerSummary *local_b8;
  size_t *local_b0;
  undefined8 *local_a8;
  WorkerSummary *local_a0;
  WorkerSummary *local_98;
  size_t *local_90;
  undefined8 *local_88;
  WorkerSummary *local_80;
  WorkerSummary *local_78;
  size_t *local_70;
  undefined8 *local_68;
  WorkerSummary *local_60;
  WorkerSummary *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  ostream *local_10;
  
  local_18 = 10;
  local_20 = 10;
  local_28 = 5;
  local_30 = 5;
  local_38 = 9;
  local_40 = 8;
  local_48 = 8;
  local_50 = 8;
  local_10 = in_RSI;
  local_58 = (WorkerSummary *)
             std::
             vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ::begin((vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
                      *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  local_60 = (WorkerSummary *)
             std::
             vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ::end((vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
                    *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  local_68 = &local_28;
  __f.l_w._4_4_ = in_stack_fffffffffffffcfc;
  __f.l_w._0_4_ = in_stack_fffffffffffffcf8;
  local_70 = (size_t *)
             std::
             for_each<__gnu_cxx::__normal_iterator<tf::TFProfObserver::WorkerSummary_const*,std::vector<tf::TFProfObserver::WorkerSummary,std::allocator<tf::TFProfObserver::WorkerSummary>>>,tf::TFProfObserver::Summary::dump_wsum(std::ostream&)const::_lambda(auto:1_const&)_1_>
                       (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,__f);
  local_78 = (WorkerSummary *)
             std::
             vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ::begin((vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
                      *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  local_80 = (WorkerSummary *)
             std::
             vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ::end((vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
                    *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  local_88 = &local_30;
  __f_00.c_w._4_4_ = in_stack_fffffffffffffcfc;
  __f_00.c_w._0_4_ = in_stack_fffffffffffffcf8;
  local_90 = (size_t *)
             std::
             for_each<__gnu_cxx::__normal_iterator<tf::TFProfObserver::WorkerSummary_const*,std::vector<tf::TFProfObserver::WorkerSummary,std::allocator<tf::TFProfObserver::WorkerSummary>>>,tf::TFProfObserver::Summary::dump_wsum(std::ostream&)const::_lambda(auto:1_const&)_2_>
                       (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,__f_00);
  local_98 = (WorkerSummary *)
             std::
             vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ::begin((vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
                      *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  local_a0 = (WorkerSummary *)
             std::
             vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ::end((vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
                    *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  local_a8 = &local_38;
  __f_01.d_w._4_4_ = in_stack_fffffffffffffcfc;
  __f_01.d_w._0_4_ = in_stack_fffffffffffffcf8;
  local_b0 = (size_t *)
             std::
             for_each<__gnu_cxx::__normal_iterator<tf::TFProfObserver::WorkerSummary_const*,std::vector<tf::TFProfObserver::WorkerSummary,std::allocator<tf::TFProfObserver::WorkerSummary>>>,tf::TFProfObserver::Summary::dump_wsum(std::ostream&)const::_lambda(auto:1_const&)_3_>
                       (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,__f_01);
  local_b8 = (WorkerSummary *)
             std::
             vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ::begin((vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
                      *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  local_c0 = (WorkerSummary *)
             std::
             vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ::end((vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
                    *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  local_c8 = &local_40;
  __f_02.avg_w._4_4_ = in_stack_fffffffffffffcfc;
  __f_02.avg_w._0_4_ = in_stack_fffffffffffffcf8;
  local_d0 = (size_t *)
             std::
             for_each<__gnu_cxx::__normal_iterator<tf::TFProfObserver::WorkerSummary_const*,std::vector<tf::TFProfObserver::WorkerSummary,std::allocator<tf::TFProfObserver::WorkerSummary>>>,tf::TFProfObserver::Summary::dump_wsum(std::ostream&)const::_lambda(auto:1_const&)_4_>
                       (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,__f_02);
  local_d8 = (WorkerSummary *)
             std::
             vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ::begin((vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
                      *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  local_e0 = (WorkerSummary *)
             std::
             vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ::end((vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
                    *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  local_e8 = &local_48;
  __f_03.min_w._4_4_ = in_stack_fffffffffffffcfc;
  __f_03.min_w._0_4_ = in_stack_fffffffffffffcf8;
  local_f0 = (size_t *)
             std::
             for_each<__gnu_cxx::__normal_iterator<tf::TFProfObserver::WorkerSummary_const*,std::vector<tf::TFProfObserver::WorkerSummary,std::allocator<tf::TFProfObserver::WorkerSummary>>>,tf::TFProfObserver::Summary::dump_wsum(std::ostream&)const::_lambda(auto:1_const&)_5_>
                       (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,__f_03);
  local_f8 = (WorkerSummary *)
             std::
             vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ::begin((vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
                      *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  local_100 = (WorkerSummary *)
              std::
              vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
              ::end((vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
                     *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  local_108 = &local_50;
  __f_04.max_w._4_4_ = in_stack_fffffffffffffcfc;
  __f_04.max_w._0_4_ = in_stack_fffffffffffffcf8;
  local_110 = (size_t *)
              std::
              for_each<__gnu_cxx::__normal_iterator<tf::TFProfObserver::WorkerSummary_const*,std::vector<tf::TFProfObserver::WorkerSummary,std::allocator<tf::TFProfObserver::WorkerSummary>>>,tf::TFProfObserver::Summary::dump_wsum(std::ostream&)const::_lambda(auto:1_const&)_6_>
                        (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,__f_04);
  poVar4 = local_10;
  local_114 = (int)std::setw((int)local_18);
  poVar4 = std::operator<<(poVar4,(_Setw)local_114);
  poVar4 = std::operator<<(poVar4,"-Worker-");
  local_118 = (int)std::setw((int)local_28 + 2);
  poVar4 = std::operator<<(poVar4,(_Setw)local_118);
  poVar4 = std::operator<<(poVar4,"Level");
  local_11c = (int)std::setw((int)local_20);
  poVar4 = std::operator<<(poVar4,(_Setw)local_11c);
  poVar4 = std::operator<<(poVar4,"Task");
  local_120 = (int)std::setw((int)local_30 + 2);
  poVar4 = std::operator<<(poVar4,(_Setw)local_120);
  poVar4 = std::operator<<(poVar4,"Count");
  local_124 = (int)std::setw((int)local_38 + 2);
  poVar4 = std::operator<<(poVar4,(_Setw)local_124);
  poVar4 = std::operator<<(poVar4,"Time (us)");
  local_128 = (int)std::setw((int)local_40 + 2);
  poVar4 = std::operator<<(poVar4,(_Setw)local_128);
  poVar4 = std::operator<<(poVar4,"Avg (us)");
  local_12c = (int)std::setw((int)local_48 + 2);
  poVar4 = std::operator<<(poVar4,(_Setw)local_12c);
  poVar4 = std::operator<<(poVar4,"Min (us)");
  local_130 = (int)std::setw((int)local_50 + 2);
  poVar4 = std::operator<<(poVar4,(_Setw)local_130);
  poVar4 = std::operator<<(poVar4,"Max (us)");
  std::operator<<(poVar4,'\n');
  local_138 = in_RDI + 0xe0;
  local_140._M_current =
       (WorkerSummary *)
       std::
       vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
       ::begin((vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
                *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  local_148 = (WorkerSummary *)
              std::
              vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
              ::end((vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
                     *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_tf::TFProfObserver::WorkerSummary_*,_std::vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>_>
                             *)in_stack_fffffffffffffd00._M_current,
                            (__normal_iterator<const_tf::TFProfObserver::WorkerSummary_*,_std::vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>_>
                             *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)), bVar2
        ) {
    local_150 = __gnu_cxx::
                __normal_iterator<const_tf::TFProfObserver::WorkerSummary_*,_std::vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>_>
                ::operator*(&local_140);
    poVar4 = local_10;
    if (local_150->count != 0) {
      local_154 = (int)std::setw((int)local_18);
      poVar4 = std::operator<<(poVar4,(_Setw)local_154);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_150->id);
      local_158 = (int)std::setw((int)local_28 + 2);
      poVar4 = std::operator<<(poVar4,(_Setw)local_158);
      std::ostream::operator<<(poVar4,local_150->level);
      local_159 = 1;
      for (local_168 = 0; uVar1 = local_168,
          sVar5 = std::array<tf::TaskType,_7UL>::size((array<tf::TaskType,_7UL> *)TASK_TYPES),
          poVar4 = local_10, uVar1 < sVar5; local_168 = local_168 + 1) {
        pvVar6 = std::array<tf::TFProfObserver::TaskSummary,_7UL>::operator[]
                           ((array<tf::TFProfObserver::TaskSummary,_7UL> *)
                            in_stack_fffffffffffffd00._M_current,
                            CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        poVar4 = local_10;
        if (pvVar6->count != 0) {
          if ((local_159 & 1) == 0) {
            local_16c = std::setw((int)local_18 + (int)local_28 + 2 + (int)local_20);
          }
          else {
            local_16c = std::setw((int)local_20);
          }
          std::operator<<(poVar4,local_16c);
          poVar4 = local_10;
          local_159 = 0;
          pvVar7 = std::array<tf::TaskType,_7UL>::operator[]
                             ((array<tf::TaskType,_7UL> *)in_stack_fffffffffffffd00._M_current,
                              CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          pcVar8 = to_string(*pvVar7);
          poVar4 = std::operator<<(poVar4,pcVar8);
          local_170 = (int)std::setw((int)local_30 + 2);
          poVar4 = std::operator<<(poVar4,(_Setw)local_170);
          pvVar6 = std::array<tf::TFProfObserver::TaskSummary,_7UL>::operator[]
                             ((array<tf::TFProfObserver::TaskSummary,_7UL> *)
                              in_stack_fffffffffffffd00._M_current,
                              CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar6->count);
          local_174 = (int)std::setw((int)local_38 + 2);
          poVar4 = std::operator<<(poVar4,(_Setw)local_174);
          pvVar6 = std::array<tf::TFProfObserver::TaskSummary,_7UL>::operator[]
                             ((array<tf::TFProfObserver::TaskSummary,_7UL> *)
                              in_stack_fffffffffffffd00._M_current,
                              CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar6->total_span);
          local_178 = (int)std::setw((int)local_40 + 2);
          poVar4 = std::operator<<(poVar4,(_Setw)local_178);
          pvVar6 = std::array<tf::TFProfObserver::TaskSummary,_7UL>::operator[]
                             ((array<tf::TFProfObserver::TaskSummary,_7UL> *)
                              in_stack_fffffffffffffd00._M_current,
                              CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          TaskSummary::avg_span(pvVar6);
          std::__cxx11::to_string(in_stack_fffffffffffffcfc);
          poVar4 = std::operator<<(poVar4,local_198);
          local_1a8 = (int)std::setw((int)local_48 + 2);
          poVar4 = std::operator<<(poVar4,(_Setw)local_1a8);
          pvVar6 = std::array<tf::TFProfObserver::TaskSummary,_7UL>::operator[]
                             ((array<tf::TFProfObserver::TaskSummary,_7UL> *)
                              in_stack_fffffffffffffd00._M_current,
                              CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar6->min_span);
          local_1ac = (int)std::setw((int)local_50 + 2);
          poVar4 = std::operator<<(poVar4,(_Setw)local_1ac);
          pvVar6 = std::array<tf::TFProfObserver::TaskSummary,_7UL>::operator[]
                             ((array<tf::TFProfObserver::TaskSummary,_7UL> *)
                              in_stack_fffffffffffffd00._M_current,
                              CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar6->max_span);
          std::operator<<(poVar4,'\n');
          std::__cxx11::string::~string(local_198);
        }
      }
      local_1b0 = (int)std::setw((int)local_30 + 4 + (int)local_18 + (int)local_28 + (int)local_20);
      poVar4 = std::operator<<(poVar4,(_Setw)local_1b0);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_150->count);
      local_1b4 = (int)std::setw((int)local_38 + 2);
      poVar4 = std::operator<<(poVar4,(_Setw)local_1b4);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_150->total_span);
      local_1b8 = (int)std::setw((int)local_40 + 2);
      poVar4 = std::operator<<(poVar4,(_Setw)local_1b8);
      WorkerSummary::avg_span(local_150);
      std::__cxx11::to_string(in_stack_fffffffffffffcfc);
      poVar4 = std::operator<<(poVar4,local_1d8);
      _Var3 = std::setw((int)local_48 + 2);
      poVar4 = std::operator<<(poVar4,_Var3);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_150->min_span);
      _Var3 = std::setw((int)local_50 + 2);
      poVar4 = std::operator<<(poVar4,_Var3);
      in_stack_fffffffffffffd00._M_current =
           (WorkerSummary *)std::ostream::operator<<(poVar4,local_150->max_span);
      std::operator<<((ostream *)in_stack_fffffffffffffd00._M_current,'\n');
      std::__cxx11::string::~string(local_1d8);
    }
    __gnu_cxx::
    __normal_iterator<const_tf::TFProfObserver::WorkerSummary_*,_std::vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>_>
    ::operator++(&local_140);
  }
  return;
}

Assistant:

inline void TFProfObserver::Summary::dump_wsum(std::ostream& os) const {
  
  // task summary
  size_t w_w{10}, t_w{10}, l_w{5}, c_w{5}, d_w{9}, avg_w{8}, min_w{8}, max_w{8};

  std::for_each(wsum.begin(), wsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    l_w = (std::max)(l_w, std::to_string(i.level).size());
  });
  
  std::for_each(wsum.begin(), wsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    c_w = (std::max)(c_w, std::to_string(i.count).size());
  });
  
  std::for_each(wsum.begin(), wsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    d_w = (std::max)(d_w, std::to_string(i.total_span).size());
  });
  
  std::for_each(wsum.begin(), wsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    avg_w = (std::max)(avg_w, std::to_string(i.avg_span()).size());
  });
  
  std::for_each(wsum.begin(), wsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    min_w = (std::max)(min_w, std::to_string(i.min_span).size());
  });
  
  std::for_each(wsum.begin(), wsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    max_w = (std::max)(max_w, std::to_string(i.max_span).size());
  });
  
  os << std::setw(w_w) << "-Worker-" 
     << std::setw(l_w+2) << "Level"
     << std::setw(t_w) << "Task"
     << std::setw(c_w+2) << "Count"
     << std::setw(d_w+2) << "Time (us)"
     << std::setw(avg_w+2) << "Avg (us)"
     << std::setw(min_w+2) << "Min (us)"
     << std::setw(max_w+2) << "Max (us)"
     << '\n';

  for(const auto& ws : wsum) {

    if(ws.count == 0) {
      continue;
    }

    os << std::setw(w_w) << ws.id
       << std::setw(l_w+2) << ws.level;
    
    bool first = true;
    for(size_t i=0; i<TASK_TYPES.size(); i++) {

      if(ws.tsum[i].count == 0) {
        continue;
      }

      os << (first ? std::setw(t_w) : std::setw(w_w + l_w + 2 + t_w));
      first = false;

      os << to_string(TASK_TYPES[i])
         << std::setw(c_w+2) << ws.tsum[i].count
         << std::setw(d_w+2) << ws.tsum[i].total_span
         << std::setw(avg_w+2) << std::to_string(ws.tsum[i].avg_span())
         << std::setw(min_w+2) << ws.tsum[i].min_span
         << std::setw(max_w+2) << ws.tsum[i].max_span
         << '\n';
    }

    // per-worker summary
    os << std::setw(w_w + l_w + t_w + c_w + 4) << ws.count
       << std::setw(d_w+2) << ws.total_span
       << std::setw(avg_w+2) << std::to_string(ws.avg_span())
       << std::setw(min_w+2) << ws.min_span
       << std::setw(max_w+2) << ws.max_span
       << '\n';
    
    //for(size_t j=0; j<w_w+l_w+t_w+4; j++) os << ' ';
    //for(size_t j=0; j<c_w+d_w+avg_w+min_w+max_w+8; j++) os << '-';
    //os <<'\n';
  }
}